

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O2

int si9ma::DP::find_way_dp(int *arr,int length,int start,int aim,int step)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  void *__s;
  size_t sVar6;
  int iVar7;
  void *pvVar8;
  void *__s_00;
  size_t __n;
  undefined8 uStack_50;
  int aiStack_48 [2];
  undefined1 *local_40;
  uint local_38;
  uint local_34;
  
  local_40 = (undefined1 *)aiStack_48;
  iVar3 = 0;
  iVar7 = 0;
  if ((((-1 < start && arr != (int *)0x0) && (iVar7 = iVar3, aim < length)) && (start < length)) &&
     (-1 < aim)) {
    uVar4 = (ulong)(uint)length * 4 + 0xf & 0xfffffffffffffff0;
    lVar1 = -uVar4;
    __s_00 = (void *)((long)aiStack_48 + lVar1);
    __s = (void *)((long)__s_00 - uVar4);
    __n = (ulong)(uint)length << 2;
    local_38 = step;
    local_34 = start;
    *(undefined8 *)((long)__s + -8) = 0x10c414;
    memset(__s_00,0,__n);
    *(undefined8 *)((long)__s + -8) = 0x10c421;
    memset(__s,0,__n);
    *(undefined4 *)((long)__s_00 + (ulong)(uint)aim * 4) = 1;
    uVar4 = (ulong)(length - 1);
    uVar2 = local_38;
    if ((int)local_38 < 1) {
      uVar2 = 0;
    }
    *(undefined8 *)((long)__s + -8) = 1;
    for (uVar5 = *(ulong *)((long)__s + -8); (int)uVar5 != uVar2 + 1;
        uVar5 = (ulong)((int)uVar5 + 1)) {
      for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 4) {
        if ((uVar5 & 1) == 0) {
          pvVar8 = __s_00;
          if (sVar6 == 0) {
            iVar7 = *(int *)((long)__s + 4);
          }
          else if (uVar4 * 4 - sVar6 == 0) {
            iVar7 = *(int *)((long)__s + uVar4 * 4 + -4);
          }
          else {
            iVar7 = *(int *)((long)__s + sVar6 + 4) + *(int *)((long)__s + (sVar6 - 4));
          }
        }
        else {
          pvVar8 = __s;
          if (sVar6 == 0) {
            iVar7 = *(int *)((long)aiStack_48 + lVar1 + 4);
          }
          else if (uVar4 * 4 - sVar6 == 0) {
            iVar7 = *(int *)((long)aiStack_48 + uVar4 * 4 + lVar1 + -4);
          }
          else {
            iVar7 = *(int *)((long)aiStack_48 + sVar6 + lVar1 + 4) +
                    *(int *)((long)aiStack_48 + sVar6 + lVar1 + -4);
          }
        }
        *(int *)((long)pvVar8 + sVar6) = iVar7;
      }
    }
    if ((uVar2 & 1) != 0) {
      __s_00 = __s;
    }
    iVar7 = *(int *)((long)__s_00 + (ulong)local_34 * 4);
  }
  return iVar7;
}

Assistant:

int DP::find_way_dp(int *arr, int length, int start, int aim, int step) {
        if(arr == nullptr || start < 0 || start >= length || aim < 0 || aim >= length)
            return 0;

        int res_arr[length];
        int res_arr_tmp[length];
        memset(res_arr,0, length*sizeof(res_arr[0]));
        memset(res_arr_tmp,0, length*sizeof(res_arr_tmp[0]));

        res_arr[aim] = 1;
        bool tmp_is_main = true;
        for (int i = 1; i <= step ; ++i) {
            for (int j = 0; j < length ; ++j) {
                if (tmp_is_main)
                    res_arr_tmp[j] = j == 0 ? res_arr[j + 1]
                                            : (j == length - 1 ? res_arr[j - 1] : res_arr[j - 1] + res_arr[j + 1]);
                else
                    res_arr[j] = j == 0 ? res_arr_tmp[j + 1]
                                        : (j == length - 1 ? res_arr_tmp[j - 1] : res_arr_tmp[j - 1] + res_arr_tmp[j + 1]);
            }
            tmp_is_main = !tmp_is_main;
        }

        return tmp_is_main ? res_arr[start] : res_arr_tmp[start];
    }